

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  bool bVar1;
  ostringstream local_198 [8];
  ostringstream buf;
  bool hasTessellation;
  DepthDrawCase *this_local;
  
  bVar1 = *(int *)((long)this + 0x84) != 1;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,
                  "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_colorMix;\nout highp vec4 vtx_colorMix;\n"
                 );
  if ((bVar1) && (*(int *)((long)this + 0x80) == 1)) {
    std::operator<<((ostream *)local_198,"out highp float v_fragDepth;\n");
  }
  if (bVar1) {
    std::operator<<((ostream *)local_198,
                    "uniform highp float u_depthBias;\nuniform highp float u_depthScale;\n");
  }
  std::operator<<((ostream *)local_198,"\nvoid main()\n{\n");
  if (bVar1) {
    if (*(int *)((long)this + 0x80) == 1) {
      std::operator<<((ostream *)local_198,
                      "\thighp float dummyZ = a_position.z;\n\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, dummyZ, 1.0);\n\tv_fragDepth = writtenZ * u_depthScale + u_depthBias;\n"
                     );
    }
    else {
      std::operator<<((ostream *)local_198,
                      "\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n"
                     );
    }
  }
  else {
    std::operator<<((ostream *)local_198,"\tgl_Position = a_position;\n");
  }
  std::operator<<((ostream *)local_198,"\tvtx_colorMix = a_colorMix;\n}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string DepthDrawCase::genVertexSource (void) const
{
	const bool			hasTessellation	= (m_state == STATE_PER_PRIMITIVE);
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in highp vec4 a_position;\n"
			"in highp vec4 a_colorMix;\n"
			"out highp vec4 vtx_colorMix;\n";

	if (!hasTessellation && m_depthType == DEPTH_USER_DEFINED)
		buf << "out highp float v_fragDepth;\n";

	if (!hasTessellation)
		buf <<	"uniform highp float u_depthBias;\n"
				"uniform highp float u_depthScale;\n";

	buf <<	"\n"
			"void main()\n"
			"{\n";

	if (hasTessellation)
		buf << "	gl_Position = a_position;\n";
	else if (m_depthType == DEPTH_USER_DEFINED)
		buf <<	"	highp float dummyZ = a_position.z;\n"
				"	highp float writtenZ = a_position.w;\n"
				"	gl_Position = vec4(a_position.xy, dummyZ, 1.0);\n"
				"	v_fragDepth = writtenZ * u_depthScale + u_depthBias;\n";
	else
		buf <<	"	highp float writtenZ = a_position.w;\n"
				"	gl_Position = vec4(a_position.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n";

	buf <<	"	vtx_colorMix = a_colorMix;\n"
			"}\n";

	return buf.str();
}